

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::FloatingPointLE<float>(char *expr1,char *expr2,float val1,float val2)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *this;
  AssertionResult *other;
  AssertionResult *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  stringstream *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  AssertionResult AVar4;
  stringstream val2_ss;
  stringstream val1_ss;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  FloatingPoint<float> *in_stack_fffffffffffffbe0;
  FloatingPoint<float> *in_stack_fffffffffffffbe8;
  char (*in_stack_fffffffffffffc08) [12];
  AssertionResult *in_stack_fffffffffffffc10;
  stringstream *ss;
  string local_3a8 [32];
  string local_388 [32];
  AssertionResult local_368;
  int local_354;
  stringstream local_350 [16];
  ostream local_340 [396];
  int local_1b4;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  FloatingPoint<float> local_28;
  FloatingPoint<float> local_24;
  float local_20;
  float local_1c [7];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  if (in_XMM1_Da <= in_XMM0_Da) {
    ss = in_RDI;
    local_20 = in_XMM1_Da;
    local_1c[0] = in_XMM0_Da;
    FloatingPoint<float>::FloatingPoint(&local_24,local_1c);
    FloatingPoint<float>::FloatingPoint(&local_28,&local_20);
    bVar1 = FloatingPoint<float>::AlmostEquals(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    if (bVar1) {
      AVar4 = AssertionSuccess();
      sVar3 = AVar4.message_.ptr_;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1b0);
      local_1b4 = (int)std::setprecision(8);
      poVar2 = std::operator<<(local_1a0,(_Setprecision)local_1b4);
      std::ostream::operator<<(poVar2,local_1c[0]);
      std::__cxx11::stringstream::stringstream(local_350);
      local_354 = (int)std::setprecision(8);
      poVar2 = std::operator<<(local_340,(_Setprecision)local_354);
      std::ostream::operator<<(poVar2,local_20);
      AssertionFailure();
      this = AssertionResult::operator<<(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      other = AssertionResult::operator<<
                        (in_stack_fffffffffffffc10,(char **)in_stack_fffffffffffffc08);
      this_00 = AssertionResult::operator<<
                          (in_stack_fffffffffffffc10,(char (*) [7])in_stack_fffffffffffffc08);
      value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              AssertionResult::operator<<(this_00,(char **)in_stack_fffffffffffffc08);
      AssertionResult::operator<<(this_00,(char (*) [3])value);
      AssertionResult::operator<<(this_00,(char (*) [11])value);
      StringStreamToString(ss);
      AssertionResult::operator<<(this_00,value);
      AssertionResult::operator<<(this_00,(char (*) [5])value);
      StringStreamToString(ss);
      AssertionResult::operator<<(this_00,value);
      AssertionResult::AssertionResult(this,other);
      std::__cxx11::string::~string(local_3a8);
      std::__cxx11::string::~string(local_388);
      AssertionResult::~AssertionResult(&local_368);
      std::__cxx11::stringstream::~stringstream(local_350);
      std::__cxx11::stringstream::~stringstream(local_1b0);
      sVar3.ptr_ = extraout_RDX;
    }
  }
  else {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = in_RDI;
  return AVar4;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}